

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode N_VWrmsNormVectorArray_ManyVector(int nvec,N_Vector *X,N_Vector *W,sunrealtype *nrm)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  undefined8 uVar1;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_38;
  undefined8 local_30;
  
  for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
    uVar1 = N_VWSqrSumLocal(*(undefined8 *)(in_RSI + local_30 * 8),
                            *(undefined8 *)(in_RDX + local_30 * 8));
    *(undefined8 *)(in_RCX + local_30 * 8) = uVar1;
  }
  for (local_30 = 0; local_30 < in_EDI; local_30 = local_30 + 1) {
    if (0.0 < *(double *)(in_RCX + local_30 * 8) /
              (double)*(long *)(**(long **)(in_RSI + local_30 * 8) + 8)) {
      local_38 = sqrt(*(double *)(in_RCX + local_30 * 8) /
                      (double)*(long *)(**(long **)(in_RSI + local_30 * 8) + 8));
    }
    else {
      local_38 = 0.0;
    }
    *(double *)(in_RCX + local_30 * 8) = local_38;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VWrmsNormVectorArray)(int nvec, N_Vector* X, N_Vector* W,
                                            sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  sunindextype i;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* call N_VWSqrSumLocal for each (X[i],W[i]) pair */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = N_VWSqrSumLocal(X[i], W[i]);
    SUNCheckLastErr();
  }

  /* accumulate totals */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  if (MANYVECTOR_COMM(X[0]) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, nrm, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(X[0])));
  }
#endif

  /* finish off WRMS norms and return */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = SUNRsqrt(nrm[i] / (MANYVECTOR_GLOBLENGTH(X[i])));
  }

  return SUN_SUCCESS;
}